

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O3

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::erase
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this,
          Iterator *it)

{
  int *piVar1;
  int key;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this_00;
  long lVar2;
  
  this_00 = it->cur_leaf_;
  if (this_00 !=
      (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *)0x0)
  {
    key = this_00->key_slots_[it->cur_idx_];
    AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
    erase_one_at(this_00,it->cur_idx_);
    (this->stats_).num_keys = (this->stats_).num_keys + -1;
    if (it->cur_leaf_->num_keys_ == 0) {
      merge(this,it->cur_leaf_,key);
    }
    lVar2 = 0xac;
    if (((this->istats_).key_domain_max_ < key) ||
       (lVar2 = 0xb0, key < (this->istats_).key_domain_min_)) {
      piVar1 = (int *)((long)&this->root_node_ + lVar2);
      *piVar1 = *piVar1 + -1;
    }
  }
  return;
}

Assistant:

void erase(Iterator it) {
    if (it.is_end()) {
      return;
    }
    T key = it.key();
    it.cur_leaf_->erase_one_at(it.cur_idx_);
    stats_.num_keys--;
    if (it.cur_leaf_->num_keys_ == 0) {
      merge(it.cur_leaf_, key);
    }
    if (key > istats_.key_domain_max_) {
      istats_.num_keys_above_key_domain--;
    } else if (key < istats_.key_domain_min_) {
      istats_.num_keys_below_key_domain--;
    }
  }